

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeinject.cc
# Opt level: O1

int4 __thiscall
PcodeInjectLibrary::restoreXmlInject
          (PcodeInjectLibrary *this,string *src,string *nm,int4 tp,Element *el)

{
  InjectPayload *pIVar1;
  uint uVar2;
  
  uVar2 = (**this->_vptr_PcodeInjectLibrary)();
  pIVar1 = (this->injection).super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>.
           _M_impl.super__Vector_impl_data._M_start[(int)uVar2];
  (*pIVar1->_vptr_InjectPayload[3])(pIVar1,el);
  (*this->_vptr_PcodeInjectLibrary[1])(this,(ulong)uVar2);
  return uVar2;
}

Assistant:

int4 PcodeInjectLibrary::restoreXmlInject(const string &src,const string &nm,int4 tp,const Element *el)

{
  int4 injectid = allocateInject(src, nm, tp);
  getPayload(injectid)->restoreXml(el);
  registerInject(injectid);
  return injectid;
}